

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzAddWMod(word *b,word *a,word w,word *mod,size_t n)

{
  word *in_RCX;
  ulong in_RDX;
  long in_RSI;
  word *in_RDI;
  ulong in_R8;
  size_t i;
  word mask;
  ulong local_38;
  ulong local_30;
  ulong local_18;
  
  local_30 = 1;
  local_18 = in_RDX;
  for (local_38 = 0; local_38 < in_R8; local_38 = local_38 + 1) {
    in_RDI[local_38] = *(long *)(in_RSI + local_38 * 8) + local_18;
    local_18 = (ulong)(int)(uint)(in_RDI[local_38] < local_18);
    local_30 = (long)(int)(uint)(in_RCX[local_38] < in_RDI[local_38]) |
               (long)(int)(uint)(in_RCX[local_38] == in_RDI[local_38]) & local_30;
  }
  zzSubAndW(in_RDI,in_RCX,in_R8,-(local_18 | local_30));
  return;
}

Assistant:

void SAFE(zzAddWMod)(word b[], const word a[], register word w, 
	const word mod[], size_t n)
{
	register word mask = 1;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmpW(mod, n, w) > 0);
	// add
	for (i = 0; i < n; ++i)
	{
		b[i] = a[i] + w;
		w = wordLess01(b[i], w);
		// mask <-  mod[i] < b[i] | mask & mod[i] == b[i];
		mask &= wordEq01(mod[i], b[i]);
		mask |= wordLess01(mod[i], b[i]);
	}
	// sub
	mask |= w;
	mask = WORD_0 - mask;
	zzSubAndW(b, mod, n, mask);
	mask = w = 0;
}